

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3Reindex(Parse *pParse,Token *pName1,Token *pName2)

{
  int iVar1;
  CollSeq *pCVar2;
  char *pcVar3;
  Table *pTVar4;
  Index *pIVar5;
  long *in_RDX;
  long in_RSI;
  Parse *in_RDI;
  long in_FS_OFFSET;
  Parse *unaff_retaddr;
  char *zColl;
  sqlite3 *db;
  int iDb;
  Index *pIndex;
  Table *pTab;
  char *zDb;
  char *z;
  CollSeq *pColl;
  Token *pObjName;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  sqlite3 *in_stack_ffffffffffffff90;
  sqlite3 *db_00;
  Table *in_stack_ffffffffffffff98;
  sqlite3 *db_01;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 uVar6;
  sqlite3 *db_02;
  int memRootPage;
  Index *pIndex_00;
  
  pIndex_00 = *(Index **)(in_FS_OFFSET + 0x28);
  db_02 = (sqlite3 *)&DAT_aaaaaaaaaaaaaaaa;
  uVar6 = 0xaaaaaaaa;
  db_01 = in_RDI->db;
  memRootPage = -0x55555556;
  iVar1 = sqlite3ReadSchema((Parse *)in_stack_ffffffffffffff90);
  if (iVar1 == 0) {
    if (in_RSI == 0) {
      reindexDatabases((Parse *)db_02,(char *)CONCAT44(uVar6,in_stack_ffffffffffffffa8));
    }
    else {
      if ((in_RDX == (long *)0x0) || (*in_RDX == 0)) {
        in_stack_ffffffffffffff98 =
             (Table *)sqlite3NameFromToken
                                (in_stack_ffffffffffffff90,
                                 (Token *)CONCAT44(in_stack_ffffffffffffff8c,
                                                   in_stack_ffffffffffffff88));
        if (in_stack_ffffffffffffff98 == (Table *)0x0) goto LAB_001c5c2c;
        pCVar2 = sqlite3FindCollSeq(db_01,(u8)((ulong)in_stack_ffffffffffffff98 >> 0x38),
                                    (char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
        if (pCVar2 != (CollSeq *)0x0) {
          reindexDatabases((Parse *)db_02,(char *)CONCAT44(uVar6,in_stack_ffffffffffffffa8));
          sqlite3DbFree(in_stack_ffffffffffffff90,
                        (void *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
          goto LAB_001c5c2c;
        }
        sqlite3DbFree(in_stack_ffffffffffffff90,
                      (void *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      }
      iVar1 = sqlite3TwoPartName((Parse *)CONCAT44(uVar6,in_stack_ffffffffffffffa8),(Token *)db_01,
                                 (Token *)in_stack_ffffffffffffff98,
                                 (Token **)in_stack_ffffffffffffff90);
      if ((-1 < iVar1) &&
         (pcVar3 = sqlite3NameFromToken
                             (in_stack_ffffffffffffff90,
                              (Token *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)
                             ), pcVar3 != (char *)0x0)) {
        if ((int)in_RDX[1] == 0) {
          db_00 = (sqlite3 *)0x0;
        }
        else {
          db_00 = (sqlite3 *)db_01->aDb[iVar1].zDbSName;
        }
        pTVar4 = sqlite3FindTable((sqlite3 *)CONCAT44(iVar1,in_stack_ffffffffffffffa8),(char *)db_01
                                  ,(char *)in_stack_ffffffffffffff98);
        if (pTVar4 == (Table *)0x0) {
          pIVar5 = sqlite3FindIndex(db_02,(char *)CONCAT44(iVar1,in_stack_ffffffffffffffa8),
                                    (char *)db_01);
          sqlite3DbFree(db_00,(void *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88))
          ;
          if (pIVar5 == (Index *)0x0) {
            sqlite3ErrorMsg(in_RDI,"unable to identify the object to be reindexed");
          }
          else {
            sqlite3SchemaToIndex(db_01,pIVar5->pTable->pSchema);
            sqlite3BeginWriteOperation
                      ((Parse *)db_01,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                       (int)in_stack_ffffffffffffff98);
            sqlite3RefillIndex(unaff_retaddr,pIndex_00,memRootPage);
          }
        }
        else {
          reindexTable((Parse *)db_01,in_stack_ffffffffffffff98,(char *)db_00);
          sqlite3DbFree(db_00,(void *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88))
          ;
        }
      }
    }
  }
LAB_001c5c2c:
  if (*(Index **)(in_FS_OFFSET + 0x28) != pIndex_00) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3Reindex(Parse *pParse, Token *pName1, Token *pName2){
  CollSeq *pColl;             /* Collating sequence to be reindexed, or NULL */
  char *z;                    /* Name of a table or index */
  const char *zDb;            /* Name of the database */
  Table *pTab;                /* A table in the database */
  Index *pIndex;              /* An index associated with pTab */
  int iDb;                    /* The database index number */
  sqlite3 *db = pParse->db;   /* The database connection */
  Token *pObjName;            /* Name of the table or index to be reindexed */

  /* Read the database schema. If an error occurs, leave an error message
  ** and code in pParse and return NULL. */
  if( SQLITE_OK!=sqlite3ReadSchema(pParse) ){
    return;
  }

  if( pName1==0 ){
    reindexDatabases(pParse, 0);
    return;
  }else if( NEVER(pName2==0) || pName2->z==0 ){
    char *zColl;
    assert( pName1->z );
    zColl = sqlite3NameFromToken(pParse->db, pName1);
    if( !zColl ) return;
    pColl = sqlite3FindCollSeq(db, ENC(db), zColl, 0);
    if( pColl ){
      reindexDatabases(pParse, zColl);
      sqlite3DbFree(db, zColl);
      return;
    }
    sqlite3DbFree(db, zColl);
  }
  iDb = sqlite3TwoPartName(pParse, pName1, pName2, &pObjName);
  if( iDb<0 ) return;
  z = sqlite3NameFromToken(db, pObjName);
  if( z==0 ) return;
  zDb = pName2->n ? db->aDb[iDb].zDbSName : 0;
  pTab = sqlite3FindTable(db, z, zDb);
  if( pTab ){
    reindexTable(pParse, pTab, 0);
    sqlite3DbFree(db, z);
    return;
  }
  pIndex = sqlite3FindIndex(db, z, zDb);
  sqlite3DbFree(db, z);
  if( pIndex ){
    iDb = sqlite3SchemaToIndex(db, pIndex->pTable->pSchema);
    sqlite3BeginWriteOperation(pParse, 0, iDb);
    sqlite3RefillIndex(pParse, pIndex, -1);
    return;
  }
  sqlite3ErrorMsg(pParse, "unable to identify the object to be reindexed");
}